

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC1751.cpp
# Opt level: O1

int jbcoin::RFC1751::wsrch(string *strWord,int iMin,int iMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = -1;
  if (iMin != iMax) {
    do {
      iVar5 = (iMax - iMin) / 2;
      iVar2 = iVar5 + iMin;
      iVar3 = std::__cxx11::string::compare((char *)strWord);
      iVar1 = iMax;
      if (iVar3 < 0) {
        iVar1 = iVar2;
      }
      if (iVar3 == 0) {
        iVar1 = iMax;
        iVar4 = iVar2;
      }
      iMax = iVar1;
      iVar1 = iVar5 + 1 + iMin;
      if (iVar3 < 1) {
        iVar1 = iMin;
      }
      iMin = iVar1;
    } while ((iVar4 < 0) && (iMin != iMax));
  }
  return iVar4;
}

Assistant:

int RFC1751::wsrch (std::string const& strWord, int iMin, int iMax)
{
    int iResult = -1;

    while (iResult < 0 && iMin != iMax)
    {
        // Have a range to search.
        int iMid    = iMin + (iMax - iMin) / 2;
        int iDir    = strWord.compare (s_dictionary[iMid]);

        if (!iDir)
        {
            iResult = iMid;     // Found it.
        }
        else if (iDir < 0)
        {
            iMax    = iMid;     // key < middle, middle is new max.
        }
        else
        {
            iMin    = iMid + 1; // key > middle, new min is past the middle.
        }
    }

    return iResult;
}